

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O0

uint8_t __thiscall
icu_63::Normalizer2WithImpl::getCombiningClass(Normalizer2WithImpl *this,UChar32 c)

{
  Normalizer2Impl *this_00;
  uint8_t uVar1;
  uint16_t norm16;
  UChar32 c_local;
  Normalizer2WithImpl *this_local;
  
  this_00 = this->impl;
  norm16 = Normalizer2Impl::getNorm16(this->impl,c);
  uVar1 = Normalizer2Impl::getCC(this_00,norm16);
  return uVar1;
}

Assistant:

virtual uint8_t
    getCombiningClass(UChar32 c) const {
        return impl.getCC(impl.getNorm16(c));
    }